

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

int main(int argc,char **argv)

{
  __pid_t _Var1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined4 extraout_EAX;
  time_t tVar6;
  int *piVar7;
  service *psVar8;
  time_t tVar9;
  int iVar10;
  char *pcVar11;
  char *state;
  socketinfo *psVar12;
  listnode *plVar13;
  listnode *plVar14;
  int s [2];
  int status;
  pollfd ufds [4];
  char tmp [92];
  sigaction act;
  undefined8 uStack_300;
  int local_2f0;
  uint local_2ec;
  uint local_2e8;
  uint local_2e4;
  uint local_2e0;
  uint local_2dc;
  pollfd local_2d8;
  uint local_2d0;
  undefined2 local_2cc;
  short local_2ca;
  uint local_2c8;
  undefined2 local_2c4;
  short local_2c2;
  undefined4 local_2bc;
  char local_2b8 [104];
  sigaction local_250;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  
  uStack_300 = (code *)0x10596d;
  _Var1 = fork();
  if (_Var1 == 0) {
    uStack_300 = (code *)0x105a60;
    bootchart_count = bootchart_init();
    if (bootchart_count < 1) {
      if (bootchart_count < 0) {
        pcVar11 = "<3>init: bootcharting init failure\n";
        iVar2 = 3;
      }
      else {
        pcVar11 = "<5>init: bootcharting ignored\n";
        iVar2 = 5;
      }
      iVar10 = 0;
      uStack_300 = (code *)0x105c00;
      log_write(iVar2,pcVar11);
    }
    else {
      iVar10 = 0;
      uStack_300 = (code *)0x105a89;
      log_write(5,"<5>init: bootcharting started (period=%d ms)\n",
                (ulong)(uint)(bootchart_count * 200));
      while (0 < bootchart_count) {
        uStack_300 = (code *)0x105a9b;
        iVar2 = bootchart_step();
        if (iVar2 < 0) break;
        bootchart_count = bootchart_count + -1;
        uStack_300 = (code *)0x105ab3;
        usleep(200000);
      }
      uStack_300 = (code *)0x105bd7;
      bootchart_finish();
    }
  }
  else {
    local_250.__sigaction_handler.sa_handler = sigchld_handler;
    local_250.sa_flags = 1;
    local_250.sa_restorer = (_func_5327 *)0x0;
    uStack_300 = (code *)0x1059a2;
    sigemptyset(&local_250.sa_mask);
    uStack_300 = (code *)0x1059b6;
    sigaction(0x11,&local_250,(sigaction *)0x0);
    uStack_300 = (code *)0x1059bd;
    umask(0);
    uStack_300 = (code *)0x1059c2;
    log_init();
    uStack_300 = (code *)0x1059d5;
    log_write(6,"<6>init: reading config file\n");
    uStack_300 = (code *)0x1059e1;
    parse_config_file("/platform//init.rc");
    uStack_300 = (code *)0x1059e8;
    import_kernel_cmdline(0);
    uStack_300 = (code *)0x1059fb;
    action_for_each_trigger("early-init",action_add_queue_tail);
    uStack_300 = (code *)0x105a00;
    drain_action_queue();
    uStack_300 = (code *)0x105a13;
    log_write(6,"<6>init: device init\n");
    uStack_300 = (code *)0x105a18;
    property_init();
    if (console[0] != '\0') {
      uStack_300 = (code *)0x105a47;
      snprintf(local_2b8,0x5c,"/dev/%s",console);
      uStack_300 = (code *)0x105a4f;
      console_name = strdup(local_2b8);
    }
    uStack_300 = (code *)0x105ac8;
    iVar2 = open(console_name,2);
    if (-1 < iVar2) {
      have_console = 1;
    }
    uStack_300 = (code *)0x105ada;
    close(iVar2);
    if (qemu[0] != '\0') {
      uStack_300 = (code *)0x105aed;
      import_kernel_cmdline(1);
    }
    uStack_300 = (code *)0x105b00;
    action_for_each_trigger("init",action_add_queue_tail);
    uStack_300 = (code *)0x105b05;
    drain_action_queue();
    uStack_300 = (code *)0x105b0a;
    uVar3 = start_property_service();
    uStack_300 = (code *)0x105b22;
    iVar2 = socketpair(1,1,0,&local_2f0);
    uVar4 = local_2ec;
    uVar5 = 0xffffffff;
    if (iVar2 == 0) {
      signal_fd = local_2f0;
      uStack_300 = (code *)0x105b4c;
      fcntl(local_2f0,2,1);
      uStack_300 = (code *)0x105b61;
      fcntl(local_2f0,4,0x800);
      uStack_300 = (code *)0x105b76;
      fcntl(local_2ec,2,1);
      uStack_300 = (code *)0x105b8b;
      fcntl(local_2ec,4,0x800);
      uVar5 = uVar4;
    }
    uStack_300 = (code *)0x105b9f;
    mkfifo("/dev/initctl",0x180);
    uStack_300 = (code *)0x105bae;
    local_2e4 = open("/dev/initctl",0x800);
    if (-1 < (int)(local_2e4 | uVar3 | uVar5)) {
      uStack_300 = (code *)0x105c1e;
      umask(0x12);
      uStack_300 = (code *)0x105c34;
      action_for_each_trigger("early-boot",action_add_queue_tail);
      uStack_300 = (code *)0x105c43;
      action_for_each_trigger("boot",action_add_queue_tail);
      uStack_300 = (code *)0x105c48;
      drain_action_queue();
      uStack_300 = (code *)0x105c5b;
      log_write(3,"<3>init: DONE\n");
      local_2d8.events = 1;
      local_2cc = 1;
      local_2c4 = 1;
      local_2bc = 0;
      local_2e8 = uVar3;
      local_2e0 = uVar5;
      local_2d8.fd = local_2e4;
      local_2d0 = uVar3;
      local_2c8 = uVar5;
LAB_00105ca5:
      do {
        while( true ) {
          do {
            local_2d8.revents = 0;
            local_2ca = 0;
            local_2c2 = 0;
            uStack_300 = (code *)0x105cb9;
            drain_action_queue();
            process_needs_restart = 0;
            uStack_300 = (code *)0x105cd5;
            service_for_each_flags(8,restart_service_if_needed);
            tVar9 = process_needs_restart;
            iVar2 = -1;
            if (process_needs_restart != 0) {
              uStack_300 = (code *)0x105ceb;
              tVar6 = gettime();
              iVar2 = ((int)tVar9 - (int)tVar6) * 1000;
              if (iVar2 < 1) {
                iVar2 = 0;
              }
            }
            uStack_300 = (code *)0x105d09;
            iVar2 = poll(&local_2d8,3,iVar2);
          } while (iVar2 < 1);
          if (local_2c2 == 1) break;
          if (local_2d8.revents == 1) {
            uStack_300 = (code *)0x105f26;
            log_write(6,"<6>init: %d %c");
            uStack_300 = (code *)0x105f37;
            read(local_2e4,&local_1b8,0x180);
            if ((local_1b8 == 0x3091969) && (local_1b4 == 1)) {
              iVar2 = (uint)(local_1b0 != 0x30) * 3 + 0xc;
              uStack_300 = sigchld_handler;
              init_reboot(iVar2);
              uStack_300 = (code *)CONCAT44(iVar2,extraout_EAX);
              write(signal_fd,(void *)((long)&uStack_300 + 4),1);
              return (int)uStack_300;
            }
          }
          if (local_2ca == 1) {
            uStack_300 = (code *)0x105f63;
            handle_property_set_fd(local_2e8);
          }
        }
        uStack_300 = (code *)0x105d2b;
        read(uVar5,local_2b8,0x5c);
        do {
          while( true ) {
            uStack_300 = (code *)0x105d3d;
            uVar4 = waitpid(-1,(int *)&local_2dc,1);
            if (uVar4 == 0xffffffff) break;
            uVar5 = local_2e0;
            if ((int)uVar4 < 1) goto LAB_00105ca5;
            uStack_300 = (code *)0x105d76;
            log_write(6,"<6>init: waitpid returned pid %d, status = %08x\n",(ulong)uVar4,
                      (ulong)local_2dc);
            uStack_300 = (code *)0x105d7e;
            psVar8 = service_find_by_pid(uVar4);
            if (psVar8 == (service *)0x0) {
              uStack_300 = (code *)0x105e65;
              log_write(3,"<3>init: untracked pid %d exited\n",(ulong)uVar4);
            }
            else {
              uStack_300 = (code *)0x105da7;
              log_write(5,"<5>init: process \'%s\', pid %d exited\n",psVar8->name,(ulong)uVar4);
              if ((psVar8->flags & 2) == 0) {
                uStack_300 = (code *)0x105dbe;
                kill(-uVar4,9);
                uStack_300 = (code *)0x105dd5;
                log_write(5,"<5>init: process \'%s\' killing any children in process group\n",
                          psVar8->name);
              }
              for (psVar12 = psVar8->sockets; psVar12 != (socketinfo *)0x0; psVar12 = psVar12->next)
              {
                uStack_300 = (code *)0x105df5;
                snprintf((char *)&local_1b8,0x80,"/dev/socket/%s",psVar12->name);
                uStack_300 = (code *)0x105dfd;
                unlink((char *)&local_1b8);
              }
              psVar8->pid = 0;
              uVar4 = psVar8->flags;
              uVar5 = uVar4 >> 1 & 1;
              psVar8->flags = uVar5 | uVar4 & 0xfffffffb;
              if (uVar5 == 0 && (uVar4 & 1) == 0) {
                uStack_300 = (code *)0x105e25;
                tVar9 = gettime();
                uVar4 = psVar8->flags;
                if ((uVar4 & 0x20) != 0) {
                  if (psVar8->time_crashed + 0xf0 < tVar9) {
                    psVar8->time_crashed = tVar9;
                    psVar8->nr_crashed = 1;
                  }
                  else {
                    iVar2 = psVar8->nr_crashed;
                    psVar8->nr_crashed = iVar2 + 1;
                    if (3 < iVar2) {
                      uStack_300 = (code *)0x105eaa;
                      log_write(3,
                                "<3>init: critical process \'%s\' exited %d times in %d minutes; rebooting into recovery mode\n"
                                ,psVar8->name,4,4);
                      uStack_300 = (code *)0x105eaf;
                      sync();
                      uStack_300 = (code *)&UNK_00105eb9;
                      reboot(0x1234567);
                    }
                  }
                }
                plVar14 = &(psVar8->onrestart).commands;
                plVar13 = (psVar8->onrestart).commands.next;
                if (plVar13 != plVar14) {
                  do {
                    uStack_300 = (code *)0x105ee2;
                    (*(code *)plVar13[1].next)(*(undefined4 *)&plVar13[1].prev,plVar13 + 2);
                    plVar13 = plVar13->next;
                  } while (plVar13 != plVar14);
                  uVar4 = psVar8->flags;
                }
                psVar8->flags = uVar4 | 8;
                pcVar11 = psVar8->name;
                state = "restarting";
              }
              else {
                pcVar11 = psVar8->name;
                state = "stopped";
              }
              uStack_300 = (code *)0x105f04;
              notify_service_state(pcVar11,state);
            }
          }
          uStack_300 = (code *)0x105d47;
          piVar7 = __errno_location();
          uVar5 = local_2e0;
        } while (*piVar7 == 4);
      } while( true );
    }
    uStack_300 = (code *)0x105bcb;
    log_write(3,"<3>init: init startup failure\n");
    iVar10 = 1;
  }
  return iVar10;
}

Assistant:

int main(int argc, char **argv)
{
    int init_fd = -1;
    int property_set_fd = -1;
    int signal_recv_fd = -1;
    int fd, fd_count, s[2];
    struct sigaction act;
    char tmp[PROP_NAME_MAX];
    struct pollfd ufds[4];
    pid_t pid;

    //mount("tmpfs", "/tmp", "tmpfs", MS_NODEV|MS_NOSUID, "mode=1777");
    //mount("proc", "/proc", "proc", MS_NOEXEC|MS_NODEV|MS_NOSUID, NULL);
    //mount("sysfs", "/sys", "sysfs", MS_NOEXEC|MS_NODEV|MS_NOSUID, NULL);

#if BOOTCHART
    pid = fork();
    if (!pid) { /* child process */
        bootchart_count = bootchart_init();
        if (bootchart_count > 0) {
            NOTICE("bootcharting started (period=%d ms)\n", bootchart_count*BOOTCHART_POLLING_MS);
        } else if (bootchart_count < 0) {
            ERROR("bootcharting init failure\n");
            return 0;
        } else {
            NOTICE("bootcharting ignored\n");
            return 0;
        }

        while (bootchart_count > 0) {
            if (bootchart_step() < 0)
                break;
            --bootchart_count;
            usleep(BOOTCHART_POLLING_MS*1000);
        }
        bootchart_finish();
        return 0;
    }
#endif

    act.sa_handler = sigchld_handler;
    act.sa_flags = SA_NOCLDSTOP;
    act.sa_restorer = NULL;
    sigemptyset(&act.sa_mask);
    sigaction(SIGCHLD, &act, 0);

    /* clear the umask */
    umask(0);

        /* We must have some place other than / to create the
         * device nodes for kmsg and null, otherwise we won't
         * be able to remount / read-only later on.
         * Now that tmpfs is mounted on /dev, we can actually
         * talk to the outside world.
         */
//    open_devnull_stdio();
    log_init();
    
    INFO("reading config file\n");
    parse_config_file(INITRC_FILE_PATH);

    /* pull the kernel commandline and ramdisk properties file in */
    import_kernel_cmdline(0);

    action_for_each_trigger("early-init", action_add_queue_tail);
    drain_action_queue();

    INFO("device init\n");

    property_init();

    if (console[0]) {
        snprintf(tmp, sizeof(tmp), "/dev/%s", console);
        console_name = strdup(tmp);
    }

    fd = open(console_name, O_RDWR);
    if (fd >= 0)
        have_console = 1;
    close(fd);

    if (qemu[0])
        import_kernel_cmdline(1); 
   
        /* execute all the boot actions to get us started */
    action_for_each_trigger("init", action_add_queue_tail);
    drain_action_queue();

        /* read any property files on system or data and
         * fire up the property service.  This must happen
         * after the ro.foo properties are set above so
         * that /data/local.prop cannot interfere with them.
         */
    property_set_fd = start_property_service();

    /* create a signalling mechanism for the sigchld handler */
    if (socketpair(AF_UNIX, SOCK_STREAM, 0, s) == 0) {
        signal_fd = s[0];
        signal_recv_fd = s[1];
        fcntl(s[0], F_SETFD, FD_CLOEXEC);
        fcntl(s[0], F_SETFL, O_NONBLOCK);
        fcntl(s[1], F_SETFD, FD_CLOEXEC);
        fcntl(s[1], F_SETFL, O_NONBLOCK);
    }

    mkfifo("/dev/initctl", 0600);
    init_fd = open("/dev/initctl", O_RDONLY|O_NONBLOCK);
    /* make sure we actually have all the pieces we need */
    if((init_fd < 0) ||
        (property_set_fd < 0) ||
        (signal_recv_fd < 0)) {
        ERROR("init startup failure\n");
        return 1;
    }
    umask(0022);

    /* execute all the boot actions to get us started */
    action_for_each_trigger("early-boot", action_add_queue_tail);
    action_for_each_trigger("boot", action_add_queue_tail);
    drain_action_queue();
    ERROR("DONE\n");

    ufds[0].fd = init_fd;
    ufds[0].events = POLLIN;
    ufds[1].fd = property_set_fd;
    ufds[1].events = POLLIN;
    ufds[2].fd = signal_recv_fd;
    ufds[2].events = POLLIN;
    fd_count = 3;

    ufds[3].events = 0;
    ufds[3].revents = 0;

    for(;;) {
        int nr, i, timeout = -1;

        for (i = 0; i < fd_count; i++)
            ufds[i].revents = 0;

        drain_action_queue();
        restart_processes();

        if (process_needs_restart) {
            timeout = (process_needs_restart - gettime()) * 1000;
            if (timeout < 0)
                timeout = 0;
        }

        nr = poll(ufds, fd_count, timeout);
        if (nr <= 0)
            continue;

        if (ufds[2].revents == POLLIN) {
            /* we got a SIGCHLD - reap and restart as needed */
            read(signal_recv_fd, tmp, sizeof(tmp));
            while (!wait_for_one_process(0))
                ;
            continue;
        }

        if (ufds[0].revents == POLLIN)
            handle_init_fd(init_fd);
        if (ufds[1].revents == POLLIN)
            handle_property_set_fd(property_set_fd);
    }

    return 0;
}